

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

int __thiscall List::printPage(List *this,int currIndex)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  range_error *this_00;
  ulong uVar4;
  int iVar5;
  anon_union_64_2_a4b029fc_for_Node_1 *__s;
  char *pcVar6;
  
  uVar4 = (ulong)(uint)currIndex;
  if (0 < this->m_pageSize) {
    uVar4 = (ulong)currIndex;
    iVar5 = 0;
    do {
      iVar1 = this->m_listSize;
      if ((long)iVar1 <= (long)uVar4) {
        this_00 = (range_error *)__cxa_allocate_exception(0x10);
        std::range_error::range_error(this_00,"Out of range");
        __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
      }
      iVar2 = this->m_foundIndex;
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 6;
      std::ostream::operator<<(&std::cout,currIndex + 1 + iVar5 + iVar2);
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0xc;
      __s = &this->m_indexArray[uVar4]->field_1;
      sVar3 = strlen((char *)__s->Digit);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)__s->Digit,sVar3);
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0x20;
      pcVar6 = (this->m_indexArray[uVar4]->field_1).data.title;
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3);
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 0x10;
      pcVar6 = (this->m_indexArray[uVar4]->field_1).data.publishingHouse;
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,sVar3);
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 6;
      std::ostream::operator<<(&std::cout,(this->m_indexArray[uVar4]->field_1).data.year);
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 6;
      std::ostream::operator<<(&std::cout,(this->m_indexArray[uVar4]->field_1).data.qtyPages);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      if ((long)iVar1 <= (long)uVar4) break;
      iVar5 = iVar5 + 1;
      uVar4 = uVar4 + 1;
    } while (iVar5 < this->m_pageSize);
  }
  return (int)uVar4;
}

Assistant:

int printPage(int currIndex) {
        for (int i = 0; i < m_pageSize; ++i, currIndex++) {
            int displayIndex = currIndex + 1 + this->m_foundIndex;
            try {
                if (currIndex >= m_listSize)
                    throw std::range_error("Out of range");
            } catch (std::range_error &e) {
                break;
            }
            cout.width(numbersOutWidth);
            cout << displayIndex;
            cout.width(sizeof(m_head->data.author));
            cout << (m_indexArray[currIndex]->data).author;
            cout.width(sizeof(m_head->data.title));
            cout << (m_indexArray[currIndex]->data).title;
            cout.width(sizeof(m_head->data.publishingHouse));
            cout << (m_indexArray[currIndex]->data).publishingHouse;
            cout.width(numbersOutWidth);
            cout << (m_indexArray[currIndex]->data).year;
            cout.width(numbersOutWidth);
            cout << (m_indexArray[currIndex]->data).qtyPages;
            cout << endl;
        }
        return currIndex;
    }